

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdecode.cpp
# Opt level: O0

pair<std::basic_string_view<char,_std::char_traits<char>_>,_libtorrent::bdecode_node> * __thiscall
libtorrent::bdecode_node::dict_at
          (pair<std::basic_string_view<char,_std::char_traits<char>_>,_libtorrent::bdecode_node>
           *__return_storage_ptr__,bdecode_node *this,int i)

{
  string_view local_c0;
  bdecode_node *local_b0;
  type *value;
  type *key;
  int local_1c;
  bdecode_node *pbStack_18;
  int i_local;
  bdecode_node *this_local;
  
  local_1c = i;
  pbStack_18 = this;
  this_local = (bdecode_node *)__return_storage_ptr__;
  dict_at_node((pair<libtorrent::bdecode_node,_libtorrent::bdecode_node> *)&key,this,i);
  value = ::std::get<0ul,libtorrent::bdecode_node,libtorrent::bdecode_node>
                    ((pair<libtorrent::bdecode_node,_libtorrent::bdecode_node> *)&key);
  local_b0 = ::std::get<1ul,libtorrent::bdecode_node,libtorrent::bdecode_node>
                       ((pair<libtorrent::bdecode_node,_libtorrent::bdecode_node> *)&key);
  local_c0 = string_value(value);
  ::std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_libtorrent::bdecode_node>::
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_true>
            (__return_storage_ptr__,&local_c0,local_b0);
  ::std::pair<libtorrent::bdecode_node,_libtorrent::bdecode_node>::~pair
            ((pair<libtorrent::bdecode_node,_libtorrent::bdecode_node> *)&key);
  return __return_storage_ptr__;
}

Assistant:

std::pair<string_view, bdecode_node> bdecode_node::dict_at(int const i) const
	{
		auto const [key, value] = dict_at_node(i);
		return {key.string_value(), value};
	}